

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynBase * ParsePostExpressions(ParseContext *ctx,SynBase *node)

{
  IntrusiveList<SynBase> aliases_00;
  IntrusiveList<SynBase> aliases_01;
  bool bVar1;
  SynIdentifier *this;
  SynMemberAccess *pSVar2;
  SynArrayIndex *this_00;
  SynBase *node_00;
  SynFunctionCall *pSVar3;
  Lexeme *pLVar4;
  SynPostModify *pSVar5;
  Lexeme *pLVar6;
  LexemeType type_00;
  InplaceStr name;
  IntrusiveList<SynCallArgument> IVar7;
  bool local_101;
  Lexeme *pos;
  IntrusiveList<SynCallArgument> arguments_2;
  IntrusiveList<SynBase> aliases_1;
  IntrusiveList<SynCallArgument> arguments_1;
  SynBase *type;
  undefined1 auStack_78 [7];
  bool shrBorrow;
  IntrusiveList<SynBase> aliases;
  SynCallArgument *local_58;
  IntrusiveList<SynCallArgument> arguments;
  SynIdentifier *memberIdentifier;
  InplaceStr member;
  Lexeme *pos_1;
  SynBase *node_local;
  ParseContext *ctx_local;
  
  pos_1 = (Lexeme *)node;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          bVar1 = ParseContext::At(ctx,lex_point);
          local_101 = true;
          if (!bVar1) {
            bVar1 = ParseContext::At(ctx,lex_obracket);
            local_101 = true;
            if (!bVar1) {
              bVar1 = ParseContext::At(ctx,lex_oparen);
              local_101 = true;
              if (!bVar1) {
                local_101 = ParseContext::At(ctx,lex_with);
              }
            }
          }
          if (local_101 == false) {
            pLVar4 = ctx->currentLexeme;
            bVar1 = ParseContext::Consume(ctx,lex_inc);
            if (bVar1) {
              pSVar5 = ParseContext::get<SynPostModify>(ctx);
              pLVar6 = ParseContext::Previous(ctx);
              SynPostModify::SynPostModify(pSVar5,pLVar4,pLVar6,(SynBase *)pos_1,true);
              pos_1 = (Lexeme *)pSVar5;
            }
            else {
              bVar1 = ParseContext::Consume(ctx,lex_dec);
              if (bVar1) {
                pSVar5 = ParseContext::get<SynPostModify>(ctx);
                pLVar6 = ParseContext::Previous(ctx);
                SynPostModify::SynPostModify(pSVar5,pLVar4,pLVar6,(SynBase *)pos_1,false);
                pos_1 = (Lexeme *)pSVar5;
              }
            }
            return (SynBase *)pos_1;
          }
          pLVar4 = ctx->currentLexeme;
          bVar1 = ParseContext::Consume(ctx,lex_point);
          if (!bVar1) break;
          bVar1 = ParseContext::At(ctx,lex_return);
          if ((bVar1) ||
             (bVar1 = anon_unknown.dwarf_104b6::CheckAt
                                (ctx,lex_string,"ERROR: member name expected after \'.\'"), bVar1))
          {
            name = ParseContext::Consume(ctx);
            this = ParseContext::get<SynIdentifier>(ctx);
            pLVar4 = ParseContext::Previous(ctx);
            pLVar6 = ParseContext::Previous(ctx);
            SynIdentifier::SynIdentifier(this,pLVar4,pLVar6,name);
            pSVar2 = ParseContext::get<SynMemberAccess>(ctx);
            pLVar4 = *(Lexeme **)&pos_1->length;
            pLVar6 = ParseContext::Previous(ctx);
            SynMemberAccess::SynMemberAccess(pSVar2,pLVar4,pLVar6,(SynBase *)pos_1,this);
            pos_1 = (Lexeme *)pSVar2;
          }
          else {
            pSVar2 = ParseContext::get<SynMemberAccess>(ctx);
            pLVar4 = ParseContext::Previous(ctx);
            pLVar6 = ParseContext::Previous(ctx);
            SynMemberAccess::SynMemberAccess
                      (pSVar2,pLVar4,pLVar6,(SynBase *)pos_1,(SynIdentifier *)0x0);
            pos_1 = (Lexeme *)pSVar2;
          }
        }
        bVar1 = ParseContext::Consume(ctx,lex_obracket);
        if (!bVar1) break;
        IVar7 = ParseCallArguments(ctx);
        anon_unknown.dwarf_104b6::CheckConsume
                  (ctx,lex_cbracket,"ERROR: \']\' not found after expression");
        this_00 = ParseContext::get<SynArrayIndex>(ctx);
        pLVar6 = ParseContext::Previous(ctx);
        local_58 = IVar7.head;
        aliases.tail = &local_58->super_SynBase;
        SynArrayIndex::SynArrayIndex(this_00,pLVar4,pLVar6,(SynBase *)pos_1,IVar7);
        pos_1 = (Lexeme *)this_00;
      }
      bVar1 = ParseContext::Consume(ctx,lex_with);
      if (bVar1) break;
      bVar1 = ParseContext::Consume(ctx,lex_oparen);
      if (bVar1) {
        IntrusiveList<SynBase>::IntrusiveList((IntrusiveList<SynBase> *)&arguments_2.tail);
        IVar7 = ParseCallArguments(ctx);
        anon_unknown.dwarf_104b6::CheckConsume
                  (ctx,lex_cparen,"ERROR: \')\' not found after function argument list");
        pSVar3 = ParseContext::get<SynFunctionCall>(ctx);
        pLVar6 = ParseContext::Previous(ctx);
        aliases_00.tail = aliases_1.head;
        aliases_00.head = &(arguments_2.tail)->super_SynBase;
        SynFunctionCall::SynFunctionCall(pSVar3,pLVar4,pLVar6,(SynBase *)pos_1,aliases_00,IVar7);
        pos_1 = (Lexeme *)pSVar3;
      }
      else {
        pLVar4 = ParseContext::Current(ctx);
        anon_unknown.dwarf_104b6::Stop(ctx,pLVar4,"ERROR: not implemented");
      }
    }
    IntrusiveList<SynBase>::IntrusiveList((IntrusiveList<SynBase> *)auStack_78);
    anon_unknown.dwarf_104b6::CheckConsume
              (ctx,lex_less,"ERROR: \'<\' not found before explicit generic type alias list");
    type._7_1_ = 0;
    do {
      node_00 = ParseType(ctx,(bool *)((long)&type + 7),false);
      if (node_00 == (SynBase *)0x0) {
        bVar1 = IntrusiveList<SynBase>::empty((IntrusiveList<SynBase> *)auStack_78);
        if (bVar1) {
          pLVar6 = ParseContext::Current(ctx);
          anon_unknown.dwarf_104b6::Report(ctx,pLVar6,"ERROR: type name is expected after \'with\'")
          ;
        }
        else {
          pLVar6 = ParseContext::Current(ctx);
          anon_unknown.dwarf_104b6::Report(ctx,pLVar6,"ERROR: type name is expected after \',\'");
        }
        break;
      }
      IntrusiveList<SynBase>::push_back((IntrusiveList<SynBase> *)auStack_78,node_00);
      bVar1 = ParseContext::Consume(ctx,lex_comma);
    } while (bVar1);
    type_00 = lex_greater;
    if ((type._7_1_ & 1) != 0) {
      type_00 = lex_shr;
    }
    anon_unknown.dwarf_104b6::CheckConsume
              (ctx,type_00,"ERROR: \'>\' not found after explicit generic type alias list");
    anon_unknown.dwarf_104b6::CheckConsume(ctx,lex_oparen,"ERROR: \'(\' is expected at this point");
    IVar7 = ParseCallArguments(ctx);
    anon_unknown.dwarf_104b6::CheckConsume
              (ctx,lex_cparen,"ERROR: \')\' not found after function argument list");
    pSVar3 = ParseContext::get<SynFunctionCall>(ctx);
    pLVar6 = ParseContext::Previous(ctx);
    aliases_01.tail = aliases.head;
    aliases_01.head = _auStack_78;
    SynFunctionCall::SynFunctionCall(pSVar3,pLVar4,pLVar6,(SynBase *)pos_1,aliases_01,IVar7);
    pos_1 = (Lexeme *)pSVar3;
  } while( true );
}

Assistant:

SynBase* ParsePostExpressions(ParseContext &ctx, SynBase *node)
{
	while(ctx.At(lex_point) || ctx.At(lex_obracket) || ctx.At(lex_oparen) || ctx.At(lex_with))
	{
		Lexeme *pos = ctx.currentLexeme;

		if(ctx.Consume(lex_point))
		{
			if(ctx.At(lex_return) || CheckAt(ctx, lex_string, "ERROR: member name expected after '.'"))
			{
				InplaceStr member = ctx.Consume();
				SynIdentifier *memberIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), member);

				node = new (ctx.get<SynMemberAccess>()) SynMemberAccess(node->begin, ctx.Previous(), node, memberIdentifier);
			}
			else
			{
				node = new (ctx.get<SynMemberAccess>()) SynMemberAccess(ctx.Previous(), ctx.Previous(), node, NULL);
			}
		}
		else if(ctx.Consume(lex_obracket))
		{
			IntrusiveList<SynCallArgument> arguments = ParseCallArguments(ctx);

			CheckConsume(ctx, lex_cbracket, "ERROR: ']' not found after expression");

			node = new (ctx.get<SynArrayIndex>()) SynArrayIndex(pos, ctx.Previous(), node, arguments);
		}
		else if(ctx.Consume(lex_with))
		{
			IntrusiveList<SynBase> aliases;

			CheckConsume(ctx, lex_less, "ERROR: '<' not found before explicit generic type alias list");

			bool shrBorrow = false;

			do
			{
				SynBase *type = ParseType(ctx, &shrBorrow);

				if(!type)
				{
					if(aliases.empty())
						Report(ctx, ctx.Current(), "ERROR: type name is expected after 'with'");
					else
						Report(ctx, ctx.Current(), "ERROR: type name is expected after ','");

					break;
				}

				aliases.push_back(type);
			}
			while(ctx.Consume(lex_comma));

			CheckConsume(ctx, shrBorrow ? lex_shr : lex_greater, "ERROR: '>' not found after explicit generic type alias list");

			CheckConsume(ctx, lex_oparen, "ERROR: '(' is expected at this point");

			IntrusiveList<SynCallArgument> arguments = ParseCallArguments(ctx);

			CheckConsume(ctx, lex_cparen, "ERROR: ')' not found after function argument list");

			node = new (ctx.get<SynFunctionCall>()) SynFunctionCall(pos, ctx.Previous(), node, aliases, arguments);
		}
		else if(ctx.Consume(lex_oparen))
		{
			IntrusiveList<SynBase> aliases;
			IntrusiveList<SynCallArgument> arguments = ParseCallArguments(ctx);

			CheckConsume(ctx, lex_cparen, "ERROR: ')' not found after function argument list");

			node = new (ctx.get<SynFunctionCall>()) SynFunctionCall(pos, ctx.Previous(), node, aliases, arguments);
		}
		else
		{
			Stop(ctx, ctx.Current(), "ERROR: not implemented");
		}
	}

	Lexeme *pos = ctx.currentLexeme;

	if(ctx.Consume(lex_inc))
		node = new (ctx.get<SynPostModify>()) SynPostModify(pos, ctx.Previous(), node, true);
	else if(ctx.Consume(lex_dec))
		node = new (ctx.get<SynPostModify>()) SynPostModify(pos, ctx.Previous(), node, false);

	return node;
}